

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.h
# Opt level: O2

void rapidjson::internal::DigitGen(DiyFp *W,DiyFp *Mp,uint64_t delta,char *buffer,int *len,int *K)

{
  uint uVar1;
  uint64_t wp_w;
  ulong rest;
  byte bVar2;
  int iVar3;
  uint64_t ten_kappa;
  char cVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uStack_60;
  
  bVar2 = -(char)Mp->e;
  ten_kappa = 1L << (bVar2 & 0x3f);
  uVar6 = Mp->f;
  wp_w = uVar6 - W->f;
  uVar7 = ten_kappa - 1 & uVar6;
  uVar6 = uVar6 >> (bVar2 & 0x3f);
  uVar1 = CountDecimalDigit32((uint32_t)uVar6);
  *len = 0;
  do {
    iVar5 = (int)uVar6;
    switch(uVar1) {
    case 0:
      iVar3 = -uVar1;
      rest = uVar7;
      do {
        cVar4 = (char)(rest * 10 >> (bVar2 & 0x3f));
        iVar5 = *len;
        if (cVar4 != '\0' || iVar5 != 0) {
          *len = iVar5 + 1;
          buffer[iVar5] = cVar4 + '0';
        }
        delta = delta * 10;
        rest = rest * 10 & ten_kappa - 1;
        iVar3 = iVar3 + 1;
      } while (delta <= rest);
      *K = *K - iVar3;
      iVar5 = *len;
      if (iVar3 < 9) {
        uVar6 = (ulong)DigitGen::kPow10[iVar3];
      }
      else {
        uVar6 = 0;
      }
      wp_w = uVar6 * wp_w;
      goto LAB_0047a003;
    case 1:
      uStack_60 = 0;
      break;
    case 2:
      uStack_60 = 10;
      goto LAB_00479f6b;
    case 3:
      uStack_60 = 100;
      goto LAB_00479f6b;
    case 4:
      uStack_60 = 1000;
      goto LAB_00479f6b;
    case 5:
      uStack_60 = 10000;
LAB_00479f6b:
      iVar5 = (int)((uVar6 & 0xffffffff) / uStack_60);
      uStack_60 = (uVar6 & 0xffffffff) % uStack_60;
      break;
    case 6:
      iVar5 = (int)((uVar6 & 0xffffffff) / 100000);
      uStack_60 = (uVar6 & 0xffffffff) % 100000;
      break;
    case 7:
      iVar5 = (int)((uVar6 & 0xffffffff) / 1000000);
      uStack_60 = (uVar6 & 0xffffffff) % 1000000;
      break;
    case 8:
      iVar5 = (int)((uVar6 & 0xffffffff) / 10000000);
      uStack_60 = (uVar6 & 0xffffffff) % 10000000;
      break;
    case 9:
      iVar5 = (int)((uVar6 & 0xffffffff) / 100000000);
      uStack_60 = (uVar6 & 0xffffffff) % 100000000;
      break;
    default:
      iVar3 = *len;
      uStack_60 = uVar6 & 0xffffffff;
      goto LAB_00479fac;
    }
    iVar3 = *len;
    uVar6 = uStack_60;
    if (iVar5 == 0) {
LAB_00479fac:
      cVar4 = '0';
      if (iVar3 != 0) goto LAB_00479fb2;
    }
    else {
      cVar4 = (char)iVar5 + '0';
LAB_00479fb2:
      *len = iVar3 + 1;
      buffer[iVar3] = cVar4;
      uVar6 = uStack_60;
    }
    uVar1 = uVar1 - 1;
    rest = ((uVar6 & 0xffffffff) << (bVar2 & 0x3f)) + uVar7;
    if (rest <= delta) {
      *K = *K + uVar1;
      ten_kappa = (ulong)DigitGen::kPow10[uVar1] << (bVar2 & 0x3f);
      iVar5 = *len;
LAB_0047a003:
      GrisuRound(buffer,iVar5,delta,rest,ten_kappa,wp_w);
      return;
    }
  } while( true );
}

Assistant:

inline void DigitGen(const DiyFp& W, const DiyFp& Mp, uint64_t delta, char* buffer, int* len, int* K) {
    static const uint32_t kPow10[] = { 1, 10, 100, 1000, 10000, 100000, 1000000, 10000000, 100000000, 1000000000 };
    const DiyFp one(uint64_t(1) << -Mp.e, Mp.e);
    const DiyFp wp_w = Mp - W;
    uint32_t p1 = static_cast<uint32_t>(Mp.f >> -one.e);
    uint64_t p2 = Mp.f & (one.f - 1);
    unsigned kappa = CountDecimalDigit32(p1); // kappa in [0, 9]
    *len = 0;

    while (kappa > 0) {
        uint32_t d = 0;
        switch (kappa) {
            case  9: d = p1 /  100000000; p1 %=  100000000; break;
            case  8: d = p1 /   10000000; p1 %=   10000000; break;
            case  7: d = p1 /    1000000; p1 %=    1000000; break;
            case  6: d = p1 /     100000; p1 %=     100000; break;
            case  5: d = p1 /      10000; p1 %=      10000; break;
            case  4: d = p1 /       1000; p1 %=       1000; break;
            case  3: d = p1 /        100; p1 %=        100; break;
            case  2: d = p1 /         10; p1 %=         10; break;
            case  1: d = p1;              p1 =           0; break;
            default:;
        }
        if (d || *len)
            buffer[(*len)++] = static_cast<char>('0' + static_cast<char>(d));
        kappa--;
        uint64_t tmp = (static_cast<uint64_t>(p1) << -one.e) + p2;
        if (tmp <= delta) {
            *K += kappa;
            GrisuRound(buffer, *len, delta, tmp, static_cast<uint64_t>(kPow10[kappa]) << -one.e, wp_w.f);
            return;
        }
    }

    // kappa = 0
    for (;;) {
        p2 *= 10;
        delta *= 10;
        char d = static_cast<char>(p2 >> -one.e);
        if (d || *len)
            buffer[(*len)++] = static_cast<char>('0' + d);
        p2 &= one.f - 1;
        kappa--;
        if (p2 < delta) {
            *K += kappa;
            int index = -static_cast<int>(kappa);
            GrisuRound(buffer, *len, delta, p2, one.f, wp_w.f * (index < 9 ? kPow10[-static_cast<int>(kappa)] : 0));
            return;
        }
    }
}